

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.hpp
# Opt level: O0

double __thiscall tfs::TMatrix<double>::max(TMatrix<double> *this)

{
  bool bVar1;
  TMatrix<double> *in_RDI;
  double result;
  double *end;
  double *data;
  double local_28;
  double *local_18;
  double local_8;
  
  bVar1 = isEmpty(in_RDI);
  if (bVar1) {
    report_problem("Error",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/../src/Matrix.hpp"
                   ,"max",0x177,"empty matrix");
    local_8 = 0.0;
  }
  else {
    local_18 = in_RDI->m_data;
    local_28 = *local_18;
    while (local_18 = local_18 + 1, local_18 < in_RDI->m_end) {
      if (local_28 < *local_18) {
        local_28 = *local_18;
      }
    }
    local_8 = local_28;
  }
  return local_8;
}

Assistant:

inline T max( void ) const {                // Return maximum value.
            if( isEmpty()) {
                log_error( "empty matrix" );
                return 0;
            }
            const T *      data = m_data;
            const T * const end = m_end;
            
            T result = *data++;
            while( data < end ) {
                if( *data > result ) {
                    result = *data;
                }
                data++;
            }
            return result;
        }